

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O3

bool test_match_object(Am_Object *object,Am_Value_List *slots_and_values_used)

{
  undefined2 key;
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Assoc as;
  Am_Value object_v;
  Am_Object proto;
  Am_Value target_v;
  Am_Assoc local_78;
  Am_Value local_70;
  Am_Object *local_60;
  Am_Value local_58;
  Am_Value local_48;
  Am_Object local_38;
  
  local_78.data = (Am_Assoc_Data *)0x0;
  local_70.type = 0;
  local_70.value.wrapper_value = (Am_Wrapper *)0x0;
  local_48.type = 0;
  local_48.value.wrapper_value = (Am_Wrapper *)0x0;
  local_60 = object;
  Am_Value_List::Start(slots_and_values_used);
  while (bVar1 = Am_Value_List::Last(slots_and_values_used), !bVar1) {
    pAVar3 = Am_Value_List::Get(slots_and_values_used);
    Am_Assoc::operator=(&local_78,pAVar3);
    if (local_78.data == (Am_Assoc_Data *)0x0) {
      Am_Error("Accessing (nullptr) Assoc");
    }
    Am_Value::Am_Value(&local_58,&(local_78.data)->value_1);
    key = local_58.value.long_value._0_2_;
    if ((2 < local_58.type - 1) && (local_58.type != 0x4015)) {
      Am_Error();
    }
    Am_Value::~Am_Value(&local_58);
    if (local_78.data == (Am_Assoc_Data *)0x0) {
      Am_Error("Accessing (nullptr) Assoc");
    }
    Am_Value::Am_Value(&local_58,&(local_78.data)->value_2);
    Am_Value::operator=(&local_48,&local_58);
    Am_Value::~Am_Value(&local_58);
    if (key == 0xb) {
      Am_Object::Am_Object((Am_Object *)&local_58,&local_48);
      Am_Object::Am_Object(&local_38,(Am_Object *)&local_58);
      bVar2 = Am_Object::Is_Instance_Of(local_60,&local_38);
      Am_Object::~Am_Object(&local_38);
      Am_Object::~Am_Object((Am_Object *)&local_58);
      if (!bVar2) break;
    }
    else {
      pAVar3 = Am_Object::Get(local_60,key,1);
      Am_Value::operator=(&local_70,pAVar3);
      bVar2 = Am_Value::Exists(&local_70);
      if ((!bVar2) || (bVar2 = Am_Value::operator!=(&local_70,&local_48), bVar2)) break;
    }
    Am_Value_List::Next(slots_and_values_used);
  }
  Am_Value::~Am_Value(&local_48);
  Am_Value::~Am_Value(&local_70);
  Am_Assoc::~Am_Assoc(&local_78);
  return bVar1;
}

Assistant:

bool
test_match_object(Am_Object &object, Am_Value_List &slots_and_values_used)
{
  Am_Assoc as;
  Am_Am_Slot_Key key;
  Am_Value object_v, target_v;
  for (slots_and_values_used.Start(); !slots_and_values_used.Last();
       slots_and_values_used.Next()) {
    as = slots_and_values_used.Get();
    key = as.Value_1();
    target_v = as.Value_2();
    if ((Am_Slot_Key)key == Am_PROTOTYPE) {
      Am_Object proto = target_v;
      if (!object.Is_Instance_Of(proto)) {
        return false;
      }
    } else {
      object_v = object.Peek(key);
      if (!object_v.Exists() || object_v != target_v) {
        return false;
      }
    }
  }
  return true;
}